

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtil.h
# Opt level: O0

uint32 Math::PopCnt32(uint32 x)

{
  uint uVar1;
  uint32 x_local;
  
  uVar1 = x - (x >> 1 & 0x55555555);
  uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
  return (uVar1 + (uVar1 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18;
}

Assistant:

static uint32 PopCnt32(uint32 x)
    {
        // sum set bits in every bit pair
        x -= (x >> 1) & 0x55555555u;
        // sum pairs into quads
        x = (x & 0x33333333u) + ((x >> 2) & 0x33333333u);
        // sum quads into octets
        x = (x + (x >> 4)) & 0x0f0f0f0fu;
        // sum octets into topmost octet
        x *= 0x01010101u;
        return x >> 24;
    }